

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void realloc_strcat(char **str,char *append)

{
  size_t sVar1;
  void *__dest;
  uint *puVar2;
  char *in_RSI;
  long *in_RDI;
  size_t old_len;
  char *new_str;
  size_t local_20;
  
  if (*in_RDI == 0) {
    local_20 = 0;
  }
  else {
    local_20 = strlen((char *)*in_RDI);
  }
  sVar1 = strlen(in_RSI);
  __dest = malloc(local_20 + sVar1 + 1);
  if (__dest == (void *)0x0) {
    puVar2 = (uint *)__errno_location();
    lafe_errc(1,(int)(ulong)*puVar2,"Out of memory");
  }
  if (*in_RDI != 0) {
    memcpy(__dest,(void *)*in_RDI,local_20);
  }
  strcpy((char *)((long)__dest + local_20),in_RSI);
  free((void *)*in_RDI);
  *in_RDI = (long)__dest;
  return;
}

Assistant:

static void
realloc_strcat(char **str, const char *append)
{
	char *new_str;
	size_t old_len;

	if (*str == NULL)
		old_len = 0;
	else
		old_len = strlen(*str);

	new_str = malloc(old_len + strlen(append) + 1);
	if (new_str == NULL)
		lafe_errc(1, errno, "Out of memory");
	if (*str != NULL)
		memcpy(new_str, *str, old_len);
	strcpy(new_str + old_len, append);
	free(*str);
	*str = new_str;
}